

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O1

Matrix InputMatrix(istream *f)

{
  istream *this;
  istream *this_00;
  Matrix ppdVar1;
  long lVar2;
  long lVar3;
  int ncols;
  int nrows;
  char check;
  int local_34;
  int local_30;
  char local_29;
  
  this = std::operator>>(f,&local_29);
  this_00 = (istream *)std::istream::operator>>((istream *)this,&local_30);
  std::istream::operator>>(this_00,&local_34);
  if (local_29 == 'M') {
    ppdVar1 = NewMatrix(local_30,local_34);
    if (0 < local_30) {
      lVar2 = 0;
      do {
        if (0 < local_34) {
          lVar3 = 0;
          do {
            std::istream::_M_extract<double>((double *)f);
            lVar3 = lVar3 + 1;
          } while (lVar3 < local_34);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < local_30);
    }
  }
  else {
    std::ios::clear((int)f + (int)*(undefined8 *)(*(long *)f + -0x18));
    ppdVar1 = (Matrix)0x0;
  }
  return ppdVar1;
}

Assistant:

Matrix
InputMatrix(std::istream &f)
{
  Matrix m;
  int i, j;
  char check;
  int nrows, ncols;

  f >> check >> nrows >> ncols;
  if (check != 'M') {
    f.clear(std::ios::badbit);
    return nullptr;
  }
  m = NewMatrix(nrows, ncols);
  for (i = 0; i < nrows; i++)
    for (j = 0; j < ncols; j++)
      f >> m[i][j];
  return m;
}